

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  
  while ((((ulong)pObj & 1) == 0 && (uVar3 = *(ulong *)pObj, (~(uint)uVar3 & 0x9fffffff) != 0))) {
    if (fFirst == 0) {
      if (p->pRefs == (int *)0x0) {
        puVar5 = &pObj->Value;
      }
      else {
        pGVar4 = p->pObjs;
        if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar5 = (uint *)(p->pRefs + (int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555);
      }
      if (1 < (int)*puVar5) break;
    }
    if ((fUseMuxes != 0) && ((uVar3 & 0x40000000) != 0)) break;
    fFirst = 0;
    Cec2_CollectSuper_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)(uVar3 >> 0x1d) & 1) | (ulong)(pObj + -(uVar3 & 0x1fffffff))),vSuper
               ,0,fUseMuxes);
    pObj = (Gia_Obj_t *)
           ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
           (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
  }
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar7 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar7] == pObj) {
        return;
      }
      lVar7 = lVar7 + 1;
    } while ((int)uVar1 != lVar7);
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar6;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar2 * 2;
      if (iVar8 <= (int)uVar2) goto LAB_00645216;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar6;
    }
    vSuper->nCap = iVar8;
  }
LAB_00645216:
  iVar8 = vSuper->nSize;
  vSuper->nSize = iVar8 + 1;
  vSuper->pArray[iVar8] = pObj;
  return;
}

Assistant:

void Cec2_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && (p->pRefs ? Gia_ObjRefNum(p, pObj) : Gia_ObjValue(pObj)) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec2_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec2_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}